

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.h
# Opt level: O1

void __thiscall cmCMakePath::cmCMakePath(cmCMakePath *this,string_view source,format fmt)

{
  undefined7 in_register_00000009;
  format in_R8B;
  string_view path;
  string local_28;
  
  path._M_str._1_7_ = in_register_00000009;
  path._M_str._0_1_ = fmt;
  path._M_len = source._M_str;
  FormatPath_abi_cxx11_(&local_28,(cmCMakePath *)source._M_len,path,in_R8B);
  std::filesystem::__cxx11::path::path(&this->Path,&local_28,auto_format);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

cmCMakePath(cm::string_view source, format fmt = generic_format) noexcept
    : Path(FormatPath(source, fmt))
  {
  }